

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

fct_junit_logger_t * fct_junit_logger_new(void)

{
  fct_junit_logger_t *pfVar1;
  long lVar2;
  fct_logger_i_vtable_t *pfVar3;
  fct_junit_logger_t *pfVar4;
  byte bVar5;
  
  bVar5 = 0;
  pfVar1 = (fct_junit_logger_t *)calloc(1,0x90);
  if (pfVar1 != (fct_junit_logger_t *)0x0) {
    pfVar3 = &fct_logger_default_vtable;
    pfVar4 = pfVar1;
    for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pfVar4->vtable).on_chk = pfVar3->on_chk;
      pfVar3 = (fct_logger_i_vtable_t *)((long)pfVar3 + ((ulong)bVar5 * -2 + 1) * 8);
      pfVar4 = (fct_junit_logger_t *)((long)pfVar4 + (ulong)bVar5 * -0x10 + 8);
    }
    (pfVar1->vtable).on_test_suite_start = fct_junit_logger__on_test_suite_start;
    (pfVar1->vtable).on_test_suite_end = fct_junit_logger__on_test_suite_end;
    (pfVar1->vtable).on_fctx_start = fct_junit_logger__on_fct_start;
    (pfVar1->vtable).on_fctx_end = fct_junit_logger__on_fctx_end;
    (pfVar1->vtable).on_delete = fct_junit_logger__on_delete;
  }
  return pfVar1;
}

Assistant:

fct_junit_logger_t *
fct_junit_logger_new(void)
{
    fct_junit_logger_t *logger =
        (fct_junit_logger_t *)calloc(1, sizeof(fct_junit_logger_t));
    if ( logger == NULL )
    {
        return NULL;
    }
    fct_logger__init((fct_logger_i*)logger);
    logger->vtable.on_test_suite_start = fct_junit_logger__on_test_suite_start;
    logger->vtable.on_test_suite_end = fct_junit_logger__on_test_suite_end;
    logger->vtable.on_fctx_start = fct_junit_logger__on_fct_start;
    logger->vtable.on_fctx_end = fct_junit_logger__on_fctx_end;
    logger->vtable.on_delete = fct_junit_logger__on_delete;
    return logger;
}